

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O0

void __thiscall
Fl_Xlib_Graphics_Driver::draw
          (Fl_Xlib_Graphics_Driver *this,Fl_RGB_Image *img,int XP,int YP,int WP,int HP,int cx,int cy
          )

{
  undefined8 uVar1;
  uchar *puVar2;
  Display *pDVar3;
  Fl_RGB_Image *img_00;
  char cVar4;
  int iVar5;
  int h;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  Fl_Display_Device *pFVar11;
  int oy;
  int ox;
  int ny;
  int nx;
  Fl_Surface_Device *_ss_1;
  Window _sw_1;
  Fl_Surface_Device *_ss;
  Window _sw;
  int H;
  int W;
  int Y;
  int X;
  int HP_local;
  int WP_local;
  int YP_local;
  int XP_local;
  Fl_RGB_Image *img_local;
  Fl_Xlib_Graphics_Driver *this_local;
  
  Y = HP;
  X = WP;
  HP_local = YP;
  WP_local = XP;
  _YP_local = img;
  img_local = (Fl_RGB_Image *)this;
  iVar5 = Fl_Image::d(&img->super_Fl_Image);
  img_00 = _YP_local;
  iVar10 = WP_local;
  iVar9 = HP_local;
  iVar7 = X;
  iVar6 = Y;
  if ((iVar5 == 0) || (_YP_local->array == (uchar *)0x0)) {
    Fl_Image::draw_empty(&_YP_local->super_Fl_Image,WP_local,HP_local);
  }
  else {
    iVar5 = Fl_Image::w(&_YP_local->super_Fl_Image);
    h = Fl_Image::h(&_YP_local->super_Fl_Image);
    iVar6 = ::start(img_00,iVar10,iVar9,iVar7,iVar6,iVar5,h,&cx,&cy,&W,&H,(int *)((long)&_sw + 4),
                    (int *)&_sw);
    if (iVar6 == 0) {
      if (_YP_local->id_ == 0) {
        iVar6 = Fl_Image::d(&_YP_local->super_Fl_Image);
        if ((iVar6 == 1) || (iVar6 = Fl_Image::d(&_YP_local->super_Fl_Image), iVar6 == 3)) {
          pDVar3 = fl_display;
          uVar1 = *(undefined8 *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10);
          iVar6 = Fl_Image::w(&_YP_local->super_Fl_Image);
          iVar7 = Fl_Image::h(&_YP_local->super_Fl_Image);
          uVar8 = XCreatePixmap(pDVar3,uVar1,iVar6,iVar7,fl_visual->depth);
          _YP_local->id_ = uVar8;
          _ss = (Fl_Surface_Device *)fl_window;
          fl_window = (Window)_YP_local->id_;
          _sw_1 = (Window)Fl_Surface_Device::surface();
          pFVar11 = Fl_Display_Device::display_device();
          (*(pFVar11->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])();
          fl_push_no_clip();
          puVar2 = _YP_local->array;
          iVar6 = Fl_Image::w(&_YP_local->super_Fl_Image);
          iVar7 = Fl_Image::h(&_YP_local->super_Fl_Image);
          iVar9 = Fl_Image::d(&_YP_local->super_Fl_Image);
          iVar10 = Fl_Image::ld(&_YP_local->super_Fl_Image);
          fl_draw_image(puVar2,0,0,iVar6,iVar7,iVar9,iVar10);
          fl_pop_clip();
          fl_window = (Window)_ss;
          (**(code **)(*(long *)_sw_1 + 0x18))();
        }
        else {
          iVar6 = Fl_Image::d(&_YP_local->super_Fl_Image);
          if ((iVar6 == 4) &&
             (cVar4 = fl_can_do_alpha_blending(), pDVar3 = fl_display, cVar4 != '\0')) {
            uVar1 = *(undefined8 *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10);
            iVar6 = Fl_Image::w(&_YP_local->super_Fl_Image);
            iVar7 = Fl_Image::h(&_YP_local->super_Fl_Image);
            uVar8 = XCreatePixmap(pDVar3,uVar1,iVar6,iVar7,0x20);
            _YP_local->id_ = uVar8;
            _ss_1 = (Fl_Surface_Device *)fl_window;
            fl_window = (Window)_YP_local->id_;
            _ny = Fl_Surface_Device::surface();
            pFVar11 = Fl_Display_Device::display_device();
            (*(pFVar11->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])();
            fl_push_no_clip();
            puVar2 = _YP_local->array;
            iVar6 = Fl_Image::w(&_YP_local->super_Fl_Image);
            iVar7 = Fl_Image::h(&_YP_local->super_Fl_Image);
            uVar8 = Fl_Image::d(&_YP_local->super_Fl_Image);
            iVar9 = Fl_Image::ld(&_YP_local->super_Fl_Image);
            fl_draw_image(puVar2,0,0,iVar6,iVar7,uVar8 | 0x40000000,iVar9);
            fl_pop_clip();
            fl_window = (Window)_ss_1;
            (*(_ny->super_Fl_Device)._vptr_Fl_Device[3])();
          }
        }
      }
      if (_YP_local->id_ == 0) {
        alpha_blend(_YP_local,W,H,_sw._4_4_,(int)_sw,cx,cy);
      }
      else {
        if (_YP_local->mask_ != 0) {
          fl_clip_box(W,H,_sw._4_4_,(int)_sw,&ox,&oy,(int *)((long)&_sw + 4),(int *)&_sw);
          cx = (ox - W) + cx;
          W = ox;
          cy = (oy - H) + cy;
          H = oy;
          XSetClipMask(fl_display,fl_gc,_YP_local->mask_);
          if (W - cx < 0) {
            Fl_Image::w(&_YP_local->super_Fl_Image);
          }
          if (H - cy < 0) {
            Fl_Image::h(&_YP_local->super_Fl_Image);
          }
          XSetClipOrigin(fl_display,fl_gc,W - cx,H - cy);
        }
        iVar6 = Fl_Image::d(&_YP_local->super_Fl_Image);
        if ((iVar6 == 4) && (cVar4 = fl_can_do_alpha_blending(), cVar4 != '\0')) {
          copy_offscreen_with_alpha(this,W,H,_sw._4_4_,(int)_sw,(ulong)_YP_local->id_,cx,cy);
        }
        else {
          copy_offscreen(this,W,H,_sw._4_4_,(int)_sw,(ulong)_YP_local->id_,cx,cy);
        }
        if (_YP_local->mask_ != 0) {
          XSetClipOrigin(fl_display,fl_gc,0);
          fl_restore_clip();
        }
      }
    }
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::draw(Fl_RGB_Image *img, int XP, int YP, int WP, int HP, int cx, int cy) {
  int X, Y, W, H;
  // Don't draw an empty image...
  if (!img->d() || !img->array) {
    img->draw_empty(XP, YP);
    return;
  }
  if (start(img, XP, YP, WP, HP, img->w(), img->h(), cx, cy, X, Y, W, H)) {
    return;
  }
  if (!img->id_) {
    if (img->d() == 1 || img->d() == 3) {
      img->id_ = fl_create_offscreen(img->w(), img->h());
      fl_begin_offscreen((Fl_Offscreen)img->id_);
      fl_draw_image(img->array, 0, 0, img->w(), img->h(), img->d(), img->ld());
      fl_end_offscreen();
    } else if (img->d() == 4 && fl_can_do_alpha_blending()) {
      img->id_ = fl_create_offscreen_with_alpha(img->w(), img->h());
      fl_begin_offscreen((Fl_Offscreen)img->id_);
      fl_draw_image(img->array, 0, 0, img->w(), img->h(), img->d() | FL_IMAGE_WITH_ALPHA,
                    img->ld());
      fl_end_offscreen();
    }
  }
  if (img->id_) {
    if (img->mask_) {
      // I can't figure out how to combine a mask with existing region,
      // so cut the image down to a clipped rectangle:
      int nx, ny; fl_clip_box(X,Y,W,H,nx,ny,W,H);
      cx += nx-X; X = nx;
      cy += ny-Y; Y = ny;
      // make X use the bitmap as a mask:
      XSetClipMask(fl_display, fl_gc, img->mask_);
      int ox = X-cx; if (ox < 0) ox += img->w();
      int oy = Y-cy; if (oy < 0) oy += img->h();
      XSetClipOrigin(fl_display, fl_gc, X-cx, Y-cy);
    }

    if (img->d() == 4 && fl_can_do_alpha_blending())
      copy_offscreen_with_alpha(X, Y, W, H, img->id_, cx, cy);
    else
      copy_offscreen(X, Y, W, H, img->id_, cx, cy);

    if (img->mask_) {
      // put the old clip region back
      XSetClipOrigin(fl_display, fl_gc, 0, 0);
      fl_restore_clip();
    }
  } else {
    // Composite image with alpha manually each time...
    alpha_blend(img, X, Y, W, H, cx, cy);
  }
}